

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O0

QJsonValue * __thiscall QJsonObject::valueImpl<QLatin1String>(QJsonObject *this,QLatin1String key)

{
  long lVar1;
  bool bVar2;
  QJsonValue *in_RDI;
  long in_FS_OFFSET;
  QLatin1String in_stack_00000000;
  qsizetype i;
  bool keyExists;
  Type in_stack_ffffffffffffff94;
  QJsonValue *in_stack_ffffffffffffff98;
  QExplicitlySharedDataPointer<QCborContainerPrivate> *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator!
                    ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x493bfc);
  if (bVar2) {
    QJsonValue::QJsonValue(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  }
  else {
    indexOf<QLatin1String>
              (in_stack_ffffffffffffffa0,in_stack_00000000,(bool *)in_stack_ffffffffffffff98);
    QJsonValue::QJsonValue(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QJsonValue QJsonObject::valueImpl(T key) const
{
    if (!o)
        return QJsonValue(QJsonValue::Undefined);

    bool keyExists;
    auto i = indexOf(o, key, &keyExists);
    if (!keyExists)
        return QJsonValue(QJsonValue::Undefined);
    return QJsonPrivate::Value::fromTrustedCbor(o->valueAt(i + 1));
}